

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memcpy_s.c
# Opt level: O1

int main(void)

{
  return 0;
}

Assistant:

int main( void )
{
#if ! defined( REGTEST ) || defined( __STDC_LIB_EXT1__ )
    char s[] = "xxxxxxxxxxx";
    set_constraint_handler_s( test_handler );

    TESTCASE( memcpy_s( s, 11, abcde, 6 ) == 0 );
    TESTCASE( s[4] == 'e' );
    TESTCASE( s[5] == '\0' );
    TESTCASE( memcpy_s( s + 5, 6, abcde, 5 ) == 0 );
    TESTCASE( s[9] == 'e' );
    TESTCASE( s[10] == 'x' );

    s[5] = 'x';

    TESTCASE( memcpy_s( s, 5, abcde, 6 ) != 0 );
    TESTCASE( memcmp( s, "\0\0\0\0\0x", 6 ) == 0 );

    TESTCASE( memcpy_s( s, 3, s + 2, 3 ) != 0 );
    TESTCASE( memcpy_s( s + 2, 3, s, 3 ) != 0 );

    /* Overlapping */
    TESTCASE( memcpy_s( s, 4, s + 3, 4 ) != 0 );
    TESTCASE( memcpy_s( s + 3, 4, s, 4 ) != 0 );

    TESTCASE( HANDLER_CALLS == 5 );
#endif
    return TEST_RESULTS;
}